

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_point_cloud.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  ostream *poVar2;
  void *pvVar3;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *this;
  double dVar4;
  double amplitude;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar5;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  timeval tVar12;
  timeval tVar13;
  transformation_t nonlinear_transformation_3;
  double nonlinear_time;
  size_t i_2;
  transformation_t nonlinear_transformation;
  rotation_t R_perturbed;
  translation_t t_perturbed;
  double threept_time_3;
  size_t i_1;
  transformation_t threept_transformation_3;
  vector<int,_std::allocator<int>_> indices3;
  double threept_time;
  size_t i;
  transformation_t threept_transformation;
  size_t iterations;
  timeval toc;
  timeval tic;
  PointCloudAdapter adapter;
  rotation_t rotation;
  translation_t position;
  MatrixXd gt;
  points_t points2;
  points_t points1;
  rotation_t rotation2;
  translation_t position2;
  rotation_t rotation1;
  translation_t position1;
  size_t numberPoints;
  double outlierFraction;
  double noise;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffff800;
  double *pdVar14;
  Matrix<double,_3,_4,_0,_3,_4> *other;
  Matrix<double,_3,_3,_0,_3,_3> *in_stack_fffffffffffff808;
  PointCloudAdapterBase *this_00;
  rotation_t *in_stack_fffffffffffff810;
  translation_t *in_stack_fffffffffffff818;
  PointCloudAdapterBase *in_stack_fffffffffffff820;
  PointCloudAdapter *in_stack_fffffffffffff828;
  PointCloudAdapterBase *in_stack_fffffffffffff830;
  double in_stack_fffffffffffff860;
  double in_stack_fffffffffffff888;
  rotation_t *in_stack_fffffffffffff890;
  translation_t *in_stack_fffffffffffff898;
  rotation_t *in_stack_fffffffffffff8a0;
  timeval *__tv;
  rotation_t *in_stack_fffffffffffff8a8;
  translation_t *in_stack_fffffffffffff8b0;
  translation_t *in_stack_fffffffffffff8b8;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *in_stack_fffffffffffffa50;
  bearingVectors_t *in_stack_fffffffffffffb40;
  double in_stack_fffffffffffffb48;
  double in_stack_fffffffffffffb50;
  size_t in_stack_fffffffffffffb58;
  rotation_t *in_stack_fffffffffffffb60;
  translation_t *in_stack_fffffffffffffb68;
  rotation_t *in_stack_fffffffffffffb70;
  translation_t *in_stack_fffffffffffffb78;
  bearingVectors_t *in_stack_fffffffffffffb88;
  MatrixXd *in_stack_fffffffffffffb90;
  ulong local_428;
  ulong local_308;
  timeval local_288;
  timeval local_278 [3];
  double in_stack_fffffffffffffdc0;
  PointCloudAdapterBase local_188 [2];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  int local_34;
  
  local_34 = 0;
  opengv::initializeRandomSeed();
  local_48 = 0x3fa999999999999a;
  local_50 = 0;
  local_58 = 10;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff808,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffff800);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  opengv::generateRandomTranslation(in_stack_fffffffffffff860);
  opengv::generateRandomRotation(in_stack_fffffffffffffdc0);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x2fd843);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x2fd850);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff828,
             (int *)in_stack_fffffffffffff820,(unsigned_long *)in_stack_fffffffffffff818);
  this_00 = local_188;
  pdVar14 = (double *)
            ((long)local_188[0]._R12.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array + 8);
  opengv::generateRandom3D3DCorrespondences
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,in_stack_fffffffffffffb88,
             in_stack_fffffffffffffb90);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x2fd8ec);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x2fd8fb);
  other = (Matrix<double,_3,_4,_0,_3,_4> *)((ulong)pdVar14 & 0xffffffff00000000);
  opengv::extractRelativePose
            (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,
             in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890,
             SUB81((ulong)in_stack_fffffffffffff888 >> 0x38,0));
  opengv::printExperimentCharacteristics
            (in_stack_fffffffffffff818,in_stack_fffffffffffff810,(double)this_00,(double)other);
  opengv::point_cloud::PointCloudAdapter::PointCloudAdapter
            (in_stack_fffffffffffff828,(points_t *)in_stack_fffffffffffff820,
             (points_t *)in_stack_fffffffffffff818,(translation_t *)in_stack_fffffffffffff810,
             (rotation_t *)this_00);
  poVar1 = std::operator<<((ostream *)&std::cout,"running threept with all the points");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar5 = extraout_XMM0_Qb;
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x2fd9e1);
  gettimeofday(local_278,(__timezone_ptr_t)0x0);
  for (local_308 = 0; local_308 < 100; local_308 = local_308 + 1) {
    opengv::point_cloud::threept_arun(in_stack_fffffffffffff820);
    Eigen::Matrix<double,_3,_4,_0,_3,_4>::operator=((Matrix<double,_3,_4,_0,_3,_4> *)this_00,other);
  }
  gettimeofday(&local_288,(__timezone_ptr_t)0x0);
  tVar12 = timeval_minus((timeval *)&local_288,(timeval *)local_278);
  tVar13 = timeval_minus((timeval *)&local_288,(timeval *)local_278);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (double)tVar12.tv_sec;
  auVar6._0_8_ = (double)tVar13.tv_usec;
  auVar6._8_8_ = uVar5;
  auVar9 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar6,auVar9);
  auVar6 = vcvtusi2sd_avx512f(auVar6,100);
  poVar1 = std::operator<<((ostream *)&std::cout,"running threept with three points only");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar5 = extraout_XMM0_Qb_00;
  opengv::getNindices((int)((ulong)in_stack_fffffffffffff820 >> 0x20));
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x2fdc02);
  gettimeofday(local_278,(__timezone_ptr_t)0x0);
  for (local_428 = 0; local_428 < 100; local_428 = local_428 + 1) {
    opengv::point_cloud::threept_arun
              (in_stack_fffffffffffff830,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff828);
    Eigen::Matrix<double,_3,_4,_0,_3,_4>::operator=((Matrix<double,_3,_4,_0,_3,_4> *)this_00,other);
  }
  gettimeofday(&local_288,(__timezone_ptr_t)0x0);
  tVar12 = timeval_minus((timeval *)&local_288,(timeval *)local_278);
  tVar13 = timeval_minus((timeval *)&local_288,(timeval *)local_278);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (double)tVar12.tv_sec;
  auVar7._0_8_ = (double)tVar13.tv_usec;
  auVar7._8_8_ = uVar5;
  auVar10 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar7,auVar10);
  auVar7 = vcvtusi2sd_avx512f(auVar7,100);
  dVar4 = auVar10._0_8_ / auVar7._0_8_;
  std::operator<<((ostream *)&std::cout,"setting perturbed pose and ");
  poVar1 = std::operator<<((ostream *)&std::cout,"performing nonlinear optimization");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x2fddea);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x2fddf9);
  uVar5 = 0;
  opengv::getPerturbedPose
            ((translation_t *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
             in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  opengv::point_cloud::PointCloudAdapterBase::sett12(this_00,(translation_t *)other);
  opengv::point_cloud::PointCloudAdapterBase::setR12(this_00,(rotation_t *)other);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x2fde65);
  gettimeofday(local_278,(__timezone_ptr_t)0x0);
  for (poVar1 = (ostream *)0x0; poVar1 < (ostream *)0x64; poVar1 = poVar1 + 1) {
    opengv::point_cloud::optimize_nonlinear(in_stack_fffffffffffff820);
    Eigen::Matrix<double,_3,_4,_0,_3,_4>::operator=((Matrix<double,_3,_4,_0,_3,_4> *)this_00,other);
  }
  __tv = &local_288;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  tVar12 = timeval_minus((timeval *)__tv,(timeval *)local_278);
  amplitude = (double)tVar12.tv_sec;
  tVar13 = timeval_minus((timeval *)&local_288,(timeval *)local_278);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = amplitude;
  auVar8._0_8_ = (double)tVar13.tv_usec;
  auVar8._8_8_ = uVar5;
  auVar10 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar8,auVar11);
  auVar7 = vcvtusi2sd_avx512f(auVar8,100);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose and ");
  std::operator<<((ostream *)&std::cout,"performing nonlinear optimization with three points only");
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  opengv::getPerturbedPose
            ((translation_t *)tVar12.tv_usec,(rotation_t *)__tv,(translation_t *)tVar13.tv_sec,
             (rotation_t *)tVar13.tv_usec,amplitude);
  opengv::point_cloud::PointCloudAdapterBase::sett12(this_00,(translation_t *)other);
  opengv::point_cloud::PointCloudAdapterBase::setR12(this_00,(rotation_t *)other);
  opengv::point_cloud::optimize_nonlinear
            (in_stack_fffffffffffff830,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff828);
  poVar2 = std::operator<<((ostream *)&std::cout,"results from threept_arun algorithm:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = Eigen::operator<<(poVar1,in_stack_fffffffffffffa50);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"results from threept_arun with 3 points only:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = Eigen::operator<<(poVar1,in_stack_fffffffffffffa50);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"results of nonlinear optimization:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = Eigen::operator<<(poVar1,in_stack_fffffffffffffa50);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "results of nonlinear optimization with 3 points only:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(poVar1,in_stack_fffffffffffffa50);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from threept_arun algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,auVar9._0_8_ / auVar6._0_8_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from threept_arun algorithm with 3 points only: ");
  this = (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *)std::ostream::operator<<(&std::cout,dVar4);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timing of nonlinear optimization: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,auVar10._0_8_ / auVar7._0_8_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  opengv::point_cloud::PointCloudAdapter::~PointCloudAdapter((PointCloudAdapter *)0x2fe33d);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x2fe34a);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector(this);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector(this);
  return local_34;
}

Assistant:

int main( int argc, char** argv )
{
  //initialize random seed
  initializeRandomSeed();
  
  //set experiment parameters
  double noise = 0.05;
  double outlierFraction = 0.0;
  size_t numberPoints = 10;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomTranslation(2.0);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //derive the correspondences based on random point-cloud
  points_t points1;
  points_t points2;
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom3D3DCorrespondences(
      position1, rotation1, position2, rotation2,
      numberPoints, noise, outlierFraction, points1, points2, gt );
    
  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation, false );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );

  //create the point-cloud adapter
  point_cloud::PointCloudAdapter adapter(
      points1, points2, position, rotation);

  //timer
  struct timeval tic;
  struct timeval toc;
  size_t iterations = 100;

  //run experiments
  std::cout << "running threept with all the points" << std::endl;
  transformation_t threept_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    threept_transformation = point_cloud::threept_arun(adapter);
  gettimeofday( &toc, 0 );
  double threept_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running threept with three points only" << std::endl;
  std::vector<int> indices3 = getNindices(3);
  transformation_t threept_transformation_3;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    threept_transformation_3 = point_cloud::threept_arun(adapter,indices3);
  gettimeofday( &toc, 0 );
  double threept_time_3 = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization" << std::endl;
  //add a small perturbation to the rotation
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1);
  adapter.sett12(t_perturbed);
  adapter.setR12(R_perturbed);
  transformation_t nonlinear_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    nonlinear_transformation = point_cloud::optimize_nonlinear(adapter);
  gettimeofday( &toc, 0 );
  double nonlinear_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization with three points only";
  std::cout << std::endl;
  //add a small perturbation to the rotation
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.01);
  adapter.sett12(t_perturbed);
  adapter.setR12(R_perturbed);
  transformation_t nonlinear_transformation_3 =
      point_cloud::optimize_nonlinear(adapter,indices3);

  //print results
  std::cout << "results from threept_arun algorithm:" << std::endl;
  std::cout << threept_transformation << std::endl << std::endl;
  std::cout << "results from threept_arun with 3 points only:" << std::endl;
  std::cout << threept_transformation_3 << std::endl << std::endl;
  std::cout << "results of nonlinear optimization:" << std::endl;
  std::cout << nonlinear_transformation << std::endl << std::endl;
  std::cout << "results of nonlinear optimization with 3 points only:" << std::endl;
  std::cout << nonlinear_transformation_3 << std::endl << std::endl;

  std::cout << "timings from threept_arun algorithm: ";
  std::cout << threept_time << std::endl;
  std::cout << "timings from threept_arun algorithm with 3 points only: ";
  std::cout << threept_time_3 << std::endl;
  std::cout << "timing of nonlinear optimization: ";
  std::cout << nonlinear_time << std::endl;
}